

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O2

void __thiscall
shaping_clipper::set_margin_curve(shaping_clipper *this,int (*points) [2],int num_points)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  pointer pfVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  float fVar11;
  
  pfVar5 = (this->margin_curve).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pfVar5 = (float)(*points)[1];
  uVar4 = num_points - 1;
  iVar2 = this->size;
  iVar1 = iVar2 / 2;
  uVar6 = 0;
  uVar9 = 0;
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
  }
  uVar7 = 0;
  do {
    if (uVar6 == uVar9) {
      for (lVar3 = (long)(int)uVar7; lVar3 <= iVar1; lVar3 = lVar3 + 1) {
        pfVar5[lVar3] = (float)points[(int)uVar4][1];
      }
      for (lVar3 = 0; lVar3 <= iVar2 / 2; lVar3 = lVar3 + 1) {
        dVar10 = pow(10.0,(double)(pfVar5[lVar3] / 20.0));
        pfVar5 = (this->margin_curve).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5[lVar3] = (float)dVar10;
        iVar2 = this->size;
      }
      return;
    }
    uVar8 = (ulong)(int)uVar7;
    if ((int)uVar7 <= (int)(iVar1 + 1U)) {
      uVar7 = iVar1 + 1U;
    }
    for (; (long)uVar8 <= (long)iVar1; uVar8 = uVar8 + 1) {
      fVar11 = ((float)(int)uVar8 * this->sample_rate) / (float)iVar2;
      if ((float)points[uVar6 + 1][0] <= fVar11) goto LAB_00104604;
      pfVar5[uVar8] =
           (float)(((points[uVar6 + 1][1] - points[uVar6][1]) * ((int)fVar11 - points[uVar6][0])) /
                   (points[uVar6 + 1][0] - points[uVar6][0]) + points[uVar6][1]);
    }
    uVar8 = (ulong)uVar7;
LAB_00104604:
    uVar6 = uVar6 + 1;
    uVar7 = (uint)uVar8;
  } while( true );
}

Assistant:

void shaping_clipper::set_margin_curve(int points[][2], int num_points) {
    this->margin_curve[0] = points[0][1];

    int j = 0;
    for (int i = 0; i < num_points - 1; i++) {
        while (j < this->size / 2 + 1 && j * this->sample_rate / this->size < points[i + 1][0]) {
            // linearly interpolate between points
            int binHz = j * this->sample_rate / this->size;
            margin_curve[j] = points[i][1] + (binHz - points[i][0]) * (points[i + 1][1] - points[i][1]) / (points[i + 1][0] - points[i][0]);
            j++;
        }
    }
    // handle bins after the last point
    while (j < this->size / 2 + 1) {
        margin_curve[j] = points[num_points - 1][1];
        j++;
    }

    // convert margin curve to linear amplitude scale
    for (j = 0; j < this->size / 2 + 1; j++) {
        margin_curve[j] = pow(10, margin_curve[j] / 20);
    }
}